

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::GLSLTestBase::checkResults(GLSLTestBase *this,texture *color_texture)

{
  long lVar1;
  int iVar2;
  MessageBuilder *this_00;
  long lVar3;
  undefined1 uVar4;
  long lVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  undefined8 auStack_188 [45];
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_data,0x100);
  Utils::texture::get(color_texture,0x1908,0x1401,
                      texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  lVar5 = 4;
  lVar3 = -1;
  do {
    if (lVar3 == 0xff) {
      iVar2 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
                [0xe])(this);
      uVar4 = (undefined1)iVar2;
      goto LAB_00a61821;
    }
    lVar5 = lVar5 + -4;
    lVar1 = lVar3 + 1;
    lVar3 = lVar3 + 1;
  } while (texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar1] == 0xff00ff00);
  local_1a0 = (undefined1  [8])((this->super_TestBase).super_TestCase.m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::operator<<((ostream *)&local_198,"Invalid texel: ");
  std::operator<<((ostream *)&local_198,(_Setbase)0x10);
  std::operator<<((ostringstream *)&local_198,0x30);
  *(undefined8 *)((long)auStack_188 + (long)local_198[-3]) = 8;
  this_00 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1a0,
                       (uint *)((long)texture_data.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start - lVar5));
  std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>," at index: "
                 );
  std::ostream::_M_insert<unsigned_long>((ulong)&this_00->m_str);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  uVar4 = 0;
LAB_00a61821:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return (bool)uVar4;
}

Assistant:

bool GLSLTestBase::checkResults(Utils::texture& color_texture) const
{
	static const GLuint		 green_color	   = 0xff00ff00;
	const GLuint			 texture_data_size = m_color_texture_width * m_color_texture_height;
	std::vector<glw::GLuint> texture_data;

	texture_data.resize(texture_data_size);

	color_texture.get(m_color_texture_format, m_color_texture_type, &texture_data[0]);

	for (GLuint i = 0; i < texture_data_size; ++i)
	{
		if (green_color != texture_data[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid texel: " << std::setbase(16)
												<< std::setfill('0') << std::setw(8) << texture_data[i]
												<< " at index: " << i << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return verifyAdditionalResults();
}